

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void __thiscall
duckdb::BitStringAggOperation::
Combine<duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
          (BitStringAggOperation *this,BitAggState<duckdb::hugeint_t> *source,
          BitAggState<duckdb::hugeint_t> *target,AggregateInputData *param_3)

{
  int64_t iVar1;
  string_t input;
  
  if (*this == (BitStringAggOperation)0x1) {
    if (source->is_set != false) {
      Bit::BitwiseOr((bitstring_t *)(this + 8),&source->value,&source->value);
      return;
    }
    input.value.pointer.ptr = (char *)param_3;
    input.value._0_8_ = *(undefined8 *)(this + 0x10);
    Assign<duckdb::string_t,duckdb::BitAggState<duckdb::hugeint_t>>
              ((BitStringAggOperation *)source,*(BitAggState<duckdb::hugeint_t> **)(this + 8),input)
    ;
    source->is_set = true;
    iVar1 = *(int64_t *)(this + 0x20);
    (source->min).lower = *(uint64_t *)(this + 0x18);
    (source->min).upper = iVar1;
    iVar1 = *(int64_t *)(this + 0x30);
    (source->max).lower = *(uint64_t *)(this + 0x28);
    (source->max).upper = iVar1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			return;
		}
		if (!target.is_set) {
			Assign(target, source.value);
			target.is_set = true;
			target.min = source.min;
			target.max = source.max;
		} else {
			Bit::BitwiseOr(source.value, target.value, target.value);
		}
	}